

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O0

void __thiscall uWS::TopicTree::drain(TopicTree *this)

{
  Subscriber *pSVar1;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  __args_1;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  __args_1_00;
  bool bVar2;
  size_type sVar3;
  reference ppSVar4;
  long lVar5;
  long in_RDI;
  int i_5;
  pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *p;
  iterator __end5;
  iterator __begin5;
  map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  res;
  int i_4;
  map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  complete;
  int i_3;
  uint64_t intersection;
  int numPerSubscriberIntersectingTopicMessages;
  map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *perSubscriberIntersectingTopicMessages [64];
  Subscriber *nextMin;
  int nonEmpty;
  int i_2;
  iterator end [64];
  iterator it [64];
  map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  intersectionCache;
  int i_1;
  int i;
  int numFilteredTriggeredTopics;
  type in_stack_fffffffffffff7a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff7b0;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff7b8;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffff7c0;
  undefined8 in_stack_fffffffffffff7d0;
  mapped_type *in_stack_fffffffffffff7d8;
  long in_stack_fffffffffffff7e0;
  key_type_conflict1 *in_stack_fffffffffffff7e8;
  mapped_type *in_stack_fffffffffffff7f0;
  _Rb_tree_const_iterator<uWS::Subscriber_*> *local_7e0;
  _Rb_tree_const_iterator<uWS::Subscriber_*> *local_7c8;
  int local_7a4;
  type local_7a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppStack_798;
  _Base_ptr local_790;
  _Base_ptr p_Stack_788;
  type local_780;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppStack_778;
  _Base_ptr local_770;
  _Base_ptr p_Stack_768;
  _Self local_758;
  _Self local_750;
  undefined1 *local_748;
  string local_740 [32];
  string local_720 [32];
  _Base_ptr local_700;
  _Base_ptr local_6f8;
  int local_6ec;
  undefined1 local_6e8 [64];
  _Base_ptr local_6a8;
  int local_69c;
  ulong local_698;
  int local_68c;
  long alStack_688 [65];
  Subscriber *local_480;
  int local_474;
  _Base_ptr local_470;
  _Base_ptr local_468;
  int local_45c;
  _Rb_tree_const_iterator<uWS::Subscriber_*> local_458 [64];
  _Rb_tree_const_iterator<uWS::Subscriber_*> local_258 [64];
  _Rb_tree_const_iterator<uWS::Subscriber_*> local_58 [6];
  _Base_ptr local_28;
  _Base_ptr local_20;
  int local_14;
  int local_10;
  int local_c;
  
  if (*(int *)(in_RDI + 0x230) != 0) {
    local_c = 0;
    for (local_10 = 0; local_10 < *(int *)(in_RDI + 0x230); local_10 = local_10 + 1) {
      sVar3 = std::
              set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
              ::size((set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
                      *)0x247b7f);
      if (sVar3 == 0) {
        std::
        map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::clear((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)0x247bd5);
        *(undefined1 *)(*(long *)(in_RDI + 0x30 + (long)local_10 * 8) + 0x18) = 0;
      }
      else {
        *(undefined8 *)(in_RDI + 0x30 + (long)local_c * 8) =
             *(undefined8 *)(in_RDI + 0x30 + (long)local_10 * 8);
        local_c = local_c + 1;
      }
    }
    *(int *)(in_RDI + 0x230) = local_c;
    if (*(int *)(in_RDI + 0x230) != 0) {
      *(undefined8 *)(in_RDI + 0x238) = 0xffffffffffffffff;
      for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x230); local_14 = local_14 + 1) {
        sVar3 = std::
                set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
                ::size((set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
                        *)0x247c86);
        bVar2 = false;
        if (sVar3 != 0) {
          pSVar1 = *(Subscriber **)(in_RDI + 0x238);
          local_20 = (_Base_ptr)
                     std::
                     set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
                     ::begin((set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
                              *)in_stack_fffffffffffff7a8);
          ppSVar4 = std::_Rb_tree_const_iterator<uWS::Subscriber_*>::operator*
                              ((_Rb_tree_const_iterator<uWS::Subscriber_*> *)
                               in_stack_fffffffffffff7b0);
          bVar2 = *ppSVar4 < pSVar1;
        }
        if (bVar2) {
          local_28 = (_Base_ptr)
                     std::
                     set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
                     ::begin((set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
                              *)in_stack_fffffffffffff7a8);
          ppSVar4 = std::_Rb_tree_const_iterator<uWS::Subscriber_*>::operator*
                              ((_Rb_tree_const_iterator<uWS::Subscriber_*> *)
                               in_stack_fffffffffffff7b0);
          *(Subscriber **)(in_RDI + 0x238) = *ppSVar4;
        }
      }
      if (*(long *)(in_RDI + 0x238) != -1) {
        std::
        map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::map((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)0x247d8e);
        local_7c8 = local_258;
        do {
          std::_Rb_tree_const_iterator<uWS::Subscriber_*>::_Rb_tree_const_iterator(local_7c8);
          local_7c8 = local_7c8 + 1;
        } while (local_7c8 != local_58);
        local_7e0 = local_458;
        do {
          std::_Rb_tree_const_iterator<uWS::Subscriber_*>::_Rb_tree_const_iterator(local_7e0);
          local_7e0 = local_7e0 + 1;
        } while (local_7e0 != local_258);
        for (local_45c = 0; local_45c < *(int *)(in_RDI + 0x230); local_45c = local_45c + 1) {
          local_468 = (_Base_ptr)
                      std::
                      set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
                      ::begin((set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
                               *)in_stack_fffffffffffff7a8);
          local_258[local_45c]._M_node = local_468;
          local_470 = (_Base_ptr)
                      std::
                      set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
                      ::end((set<uWS::Subscriber_*,_std::less<uWS::Subscriber_*>,_std::allocator<uWS::Subscriber_*>_>
                             *)in_stack_fffffffffffff7a8);
          local_458[local_45c]._M_node = local_470;
        }
        local_474 = *(int *)(in_RDI + 0x230);
        while (local_474 != 0) {
          local_480 = (Subscriber *)0xffffffffffffffff;
          local_68c = 0;
          local_698 = 0;
          for (local_69c = 0; local_69c < *(int *)(in_RDI + 0x230); local_69c = local_69c + 1) {
            bVar2 = std::operator!=(local_258 + local_69c,local_458 + local_69c);
            if ((bVar2) &&
               (ppSVar4 = std::_Rb_tree_const_iterator<uWS::Subscriber_*>::operator*
                                    ((_Rb_tree_const_iterator<uWS::Subscriber_*> *)
                                     in_stack_fffffffffffff7b0),
               *ppSVar4 == *(Subscriber **)(in_RDI + 0x238))) {
              local_698 = 1L << ((byte)local_69c & 0x3f) | local_698;
              alStack_688[local_68c] = *(long *)(in_RDI + 0x30 + (long)local_69c * 8) + 0x60;
              local_68c = local_68c + 1;
              local_6a8 = (_Base_ptr)
                          std::_Rb_tree_const_iterator<uWS::Subscriber_*>::operator++
                                    (in_stack_fffffffffffff7b8._M_node,
                                     (int)((ulong)in_stack_fffffffffffff7b0 >> 0x20));
              bVar2 = std::operator==(local_258 + local_69c,local_458 + local_69c);
              pSVar1 = local_480;
              if (bVar2) {
                local_474 = local_474 + -1;
              }
              else {
                ppSVar4 = std::_Rb_tree_const_iterator<uWS::Subscriber_*>::operator*
                                    ((_Rb_tree_const_iterator<uWS::Subscriber_*> *)
                                     in_stack_fffffffffffff7b0);
                if (*ppSVar4 < pSVar1) {
                  ppSVar4 = std::_Rb_tree_const_iterator<uWS::Subscriber_*>::operator*
                                      ((_Rb_tree_const_iterator<uWS::Subscriber_*> *)
                                       in_stack_fffffffffffff7b0);
                  local_480 = *ppSVar4;
                }
              }
            }
            else {
              bVar2 = std::operator!=(local_258 + local_69c,local_458 + local_69c);
              pSVar1 = local_480;
              if ((bVar2) &&
                 (ppSVar4 = std::_Rb_tree_const_iterator<uWS::Subscriber_*>::operator*
                                      ((_Rb_tree_const_iterator<uWS::Subscriber_*> *)
                                       in_stack_fffffffffffff7b0), *ppSVar4 < pSVar1)) {
                ppSVar4 = std::_Rb_tree_const_iterator<uWS::Subscriber_*>::operator*
                                    ((_Rb_tree_const_iterator<uWS::Subscriber_*> *)
                                     in_stack_fffffffffffff7b0);
                local_480 = *ppSVar4;
              }
            }
          }
          std::
          map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::operator[]((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
          lVar5 = std::__cxx11::string::length();
          if (lVar5 == 0) {
            std::
            map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::map((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)0x2481e4);
            for (local_6ec = 0; local_6ec < local_68c; local_6ec = local_6ec + 1) {
              local_6f8 = (_Base_ptr)
                          std::
                          map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ::begin((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)in_stack_fffffffffffff7a8);
              local_700 = (_Base_ptr)
                          std::
                          map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ::end((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 *)in_stack_fffffffffffff7a8);
              std::
              map<unsigned_int,std::pair<std::__cxx11::string,std::__cxx11::string>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>>>
              ::
              insert<std::_Rb_tree_iterator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,std::__cxx11::string>>>>
                        ((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7c0,
                         in_stack_fffffffffffff7b8);
            }
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (in_stack_fffffffffffff7b0);
            local_748 = local_6e8;
            local_750._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::begin((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)in_stack_fffffffffffff7a8);
            local_758._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::end((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffff7a8);
            while (bVar2 = std::operator!=(&local_750,&local_758), bVar2) {
              std::
              _Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)0x24831a);
              std::__cxx11::string::append(local_740);
              std::__cxx11::string::append(local_720);
              std::
              _Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff7b0);
            }
            in_stack_fffffffffffff7e8 = *(key_type_conflict1 **)(in_RDI + 0x238);
            in_stack_fffffffffffff7e0 = in_RDI;
            in_stack_fffffffffffff7f0 =
                 std::
                 map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator=(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
            std::
            pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
            __args_1.first._M_str = (char *)in_stack_fffffffffffff7d8;
            __args_1.first._M_len = in_stack_fffffffffffff7d0;
            __args_1.second._M_len = in_stack_fffffffffffff7e0;
            __args_1.second._M_str = (char *)in_stack_fffffffffffff7e8;
            in_stack_fffffffffffff7a8 = local_780;
            in_stack_fffffffffffff7b0 = ppStack_778;
            in_stack_fffffffffffff7b8._M_node = local_770;
            in_stack_fffffffffffff7c0._M_node = p_Stack_768;
            std::
            function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
            ::operator()((function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
                          *)p_Stack_768,(Subscriber *)local_770,__args_1);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair(in_stack_fffffffffffff7b0);
            std::
            map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::~map((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x248430);
          }
          else {
            in_stack_fffffffffffff7d0 = *(undefined8 *)(in_RDI + 0x238);
            in_stack_fffffffffffff7d8 =
                 std::
                 map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[]((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
            std::
            pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
            __args_1_00.first._M_str = (char *)in_stack_fffffffffffff7d8;
            __args_1_00.first._M_len = in_stack_fffffffffffff7d0;
            __args_1_00.second._M_len = in_stack_fffffffffffff7e0;
            __args_1_00.second._M_str = (char *)in_stack_fffffffffffff7e8;
            in_stack_fffffffffffff7a8 = local_7a0;
            in_stack_fffffffffffff7b0 = ppStack_798;
            in_stack_fffffffffffff7b8._M_node = local_790;
            in_stack_fffffffffffff7c0._M_node = p_Stack_788;
            std::
            function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
            ::operator()((function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
                          *)p_Stack_788,(Subscriber *)local_790,__args_1_00);
          }
          *(Subscriber **)(in_RDI + 0x238) = local_480;
        }
        std::
        map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~map((map<unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)0x2484e9);
      }
      for (local_7a4 = 0; local_7a4 < *(int *)(in_RDI + 0x230); local_7a4 = local_7a4 + 1) {
        std::
        map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::clear((map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)0x24853d);
        *(undefined1 *)(*(long *)(in_RDI + 0x30 + (long)local_7a4 * 8) + 0x18) = 0;
      }
      *(undefined4 *)(in_RDI + 0x230) = 0;
    }
  }
  return;
}

Assistant:

void drain() {

        /* Do nothing if nothing to send */
        if (!numTriggeredTopics) {
            return;
        }

        /* bug fix: Filter triggered topics without subscribers */
        int numFilteredTriggeredTopics = 0;
        for (int i = 0; i < numTriggeredTopics; i++) {
            if (triggeredTopics[i]->subs.size()) {
                triggeredTopics[numFilteredTriggeredTopics++] = triggeredTopics[i];
            } else {
                /* If we no longer have any subscribers, yet still keep this Topic alive (parent),
                 * make sure to clear its potential messages. */
                triggeredTopics[i]->messages.clear();
                triggeredTopics[i]->triggered = false;
            }
        }
        numTriggeredTopics = numFilteredTriggeredTopics;

        if (!numTriggeredTopics) {
            return;
        }

        /* bug fix: update min, as the one tracked via subscribe gets invalid as you unsubscribe */
        min = (Subscriber *)UINTPTR_MAX;
        for (int i = 0; i < numTriggeredTopics; i++) {
            if ((triggeredTopics[i]->subs.size()) && (min > *triggeredTopics[i]->subs.begin())) {
                min = *triggeredTopics[i]->subs.begin();
            }
        }

        /* Check if we really have any sockets still */
        if (min != (Subscriber *)UINTPTR_MAX) {

            /* Up to 64 triggered Topics per batch */
            std::map<uint64_t, std::pair<std::string, std::string>> intersectionCache;

            /* Loop over these here */
            std::set<Subscriber *>::iterator it[64];
            std::set<Subscriber *>::iterator end[64];
            for (int i = 0; i < numTriggeredTopics; i++) {
                it[i] = triggeredTopics[i]->subs.begin();
                end[i] = triggeredTopics[i]->subs.end();
            }
            
            /* Empty all sets from unique subscribers */
            for (int nonEmpty = numTriggeredTopics; nonEmpty; ) {

                Subscriber *nextMin = (Subscriber *)UINTPTR_MAX;

                /* The message sets relevant for this intersection */
                std::map<unsigned int, std::pair<std::string, std::string>> *perSubscriberIntersectingTopicMessages[64];
                int numPerSubscriberIntersectingTopicMessages = 0;

                uint64_t intersection = 0;

                for (int i = 0; i < numTriggeredTopics; i++) {
                    if ((it[i] != end[i]) && (*it[i] == min)) {

                        /* Mark this intersection */
                        intersection |= ((uint64_t)1 << i);
                        perSubscriberIntersectingTopicMessages[numPerSubscriberIntersectingTopicMessages++] = &triggeredTopics[i]->messages;

                        it[i]++;
                        if (it[i] == end[i]) {
                            nonEmpty--;
                        }
                        else {
                            if (nextMin > *it[i]) {
                                nextMin = *it[i];
                            }
                        }
                    }
                    else {
                        /* We need to lower nextMin to us, in the case of min being the last in a set */
                        if ((it[i] != end[i]) && (nextMin > *it[i])) {
                            nextMin = *it[i];
                        }
                    }
                }

                /* Generate cache for intersection */
                if (intersectionCache[intersection].first.length() == 0) {

                    /* Build the union in order without duplicates */
                    std::map<unsigned int, std::pair<std::string, std::string>> complete;
                    for (int i = 0; i < numPerSubscriberIntersectingTopicMessages; i++) {
                        complete.insert(perSubscriberIntersectingTopicMessages[i]->begin(), perSubscriberIntersectingTopicMessages[i]->end());
                    }

                    /* Create the linear cache, {inflated, deflated} */
                    std::pair<std::string, std::string> res;
                    for (auto &p : complete) {
                        res.first.append(p.second.first);
                        res.second.append(p.second.second);
                    }

                    cb(min, intersectionCache[intersection] = std::move(res));
                }
                else {
                    cb(min, intersectionCache[intersection]);
                }

                min = nextMin;
            }

        }

        /* Clear messages of triggered Topics */
        for (int i = 0; i < numTriggeredTopics; i++) {
            triggeredTopics[i]->messages.clear();
            triggeredTopics[i]->triggered = false;
        }
        numTriggeredTopics = 0;
    }